

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_test(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  do {
    sVar2 = stbi__get8(s);
    psVar1 = (stbi_uc *)(anon_var_dwarf_456fe + lVar5);
    if (sVar2 != *psVar1) break;
    bVar6 = lVar5 != 3;
    lVar5 = lVar5 + 1;
  } while (bVar6);
  uVar3 = 0;
  if (sVar2 == *psVar1) {
    iVar4 = 0x54;
    do {
      stbi__get8(s);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    lVar5 = 0;
    do {
      sVar2 = stbi__get8(s);
      psVar1 = (stbi_uc *)("PICT" + lVar5);
      if (sVar2 != *psVar1) break;
      bVar6 = lVar5 != 3;
      lVar5 = lVar5 + 1;
    } while (bVar6);
    uVar3 = (uint)(sVar2 == *psVar1);
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar3;
}

Assistant:

static int stbi__pic_test(stbi__context *s)
{
   int r = stbi__pic_test_core(s);
   stbi__rewind(s);
   return r;
}